

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          void *mem,Arena *arena)

{
  bool bVar1;
  int v1;
  int v2;
  type_conflict tVar2;
  LogMessage *pLVar3;
  uintptr_t uVar4;
  Arena **v1_00;
  void **v2_00;
  undefined1 auVar5 [16];
  LogMessageFatal local_198 [23];
  Voidify local_181;
  void *local_180;
  string *local_178;
  string *absl_log_internal_check_op_result_3;
  undefined8 local_168;
  LogMessageFatal local_160 [23];
  Voidify local_149;
  unsigned_long local_148;
  unsigned_long local_140;
  string *local_138;
  string *absl_log_internal_check_op_result_2;
  size_t offset_2;
  uintptr_t offsets;
  long local_118;
  size_t offset_1;
  undefined8 local_108;
  LogMessageFatal local_100 [23];
  Voidify local_e9;
  string *local_e8;
  string *absl_log_internal_check_op_result_1;
  size_t offset;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  LogMessageFatal local_c0 [22];
  Voidify local_aa [2];
  void *local_a8;
  char *src;
  size_t size;
  char *dst;
  bool kMustBeFunc;
  undefined8 uStack_88;
  Tag as_tag;
  undefined8 local_80;
  LogMessageFatal local_78 [19];
  Voidify local_65;
  uint local_64;
  unsigned_long local_60;
  string *local_58;
  string *absl_log_internal_check_op_result;
  Arena *arena_local;
  void *mem_local;
  MessageLite *prototype_for_copy_local;
  MessageLite *prototype_for_func_local;
  MessageCreator *this_local;
  long local_20;
  _Alloc_hider *local_18;
  long local_10;
  
  absl_log_internal_check_op_result = (string *)arena;
  arena_local = (Arena *)mem;
  mem_local = prototype_for_copy;
  prototype_for_copy_local = prototype_for_func;
  prototype_for_func_local = (MessageLite *)this;
  local_60 = absl::lts_20240722::log_internal::GetReferenceableValue
                       ((ulong)mem % (ulong)this->alignment_);
  local_64 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_58 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                       (&local_60,&local_64,"reinterpret_cast<uintptr_t>(mem) % alignment_ == 0u");
  if (local_58 != (string *)0x0) {
    _uStack_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
               ,0x4aa,uStack_88,uStack_88._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_65,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
  }
  dst._7_1_ = tag(this);
  dst._6_1_ = 0;
  if (dst._7_1_ < kZeroInit) {
    NoopDebugCounter::Inc((NoopDebugCounter *)((long)&dst + 5));
    this_local = (MessageCreator *)
                 (*(this->field_3).func_)
                           (prototype_for_copy_local,arena_local,
                            (Arena *)absl_log_internal_check_op_result);
  }
  else {
    size = (size_t)arena_local;
    src = (char *)(ulong)this->allocation_size_;
    local_a8 = mem_local;
    if (dst._7_1_ == kZeroInit) {
      bVar1 = std::
              all_of<char_const*,google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>(google::protobuf::MessageLite_const*,google::protobuf::MessageLite_const*,void*,google::protobuf::Arena*)const::_lambda(auto:1)_1_>
                        ((long)mem_local + 0x10);
      offset._7_1_ = 0;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d0,
                   "std::all_of(src + sizeof(MessageLite), src + size, [](auto c) { return c == 0; })"
                  );
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
                   ,0x4c7,local_d0._M_len,local_d0._M_str);
        offset._7_1_ = 1;
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_c0);
        absl::lts_20240722::log_internal::Voidify::operator&&(local_aa,pLVar3);
      }
      if ((offset._7_1_ & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c0);
      }
      if (src < (char *)0x21) {
        memset(src + (size - 0x10),0,0x10);
      }
      else if (src < (char *)0x41) {
        memset((void *)(size + 0x10),0,0x10);
        memset(src + (size - 0x20),0,0x20);
      }
      else {
        for (absl_log_internal_check_op_result_1 = (string *)0x10;
            absl_log_internal_check_op_result_1 + 2 < src;
            absl_log_internal_check_op_result_1 = absl_log_internal_check_op_result_1 + 2) {
          local_18 = &absl_log_internal_check_op_result_1[2]._M_dataplus + size;
          memset(&absl_log_internal_check_op_result_1->_M_dataplus + size,0,0x40);
        }
        memset(src + (size - 0x40),0,0x40);
      }
    }
    else {
      v1 = absl::lts_20240722::log_internal::GetReferenceableValue((int)dst._7_1_);
      v2 = absl::lts_20240722::log_internal::GetReferenceableValue(1);
      local_e8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           (v1,v2,"+as_tag == +kMemcpy");
      if (local_e8 != (string *)0x0) {
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e8);
        local_108 = auVar5._8_8_;
        offset_1 = auVar5._0_8_;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
                   ,0x4d8,offset_1,local_108);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_100);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_e9,pLVar3);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_100);
      }
      local_e8 = (string *)0x0;
      if (src < (char *)0x21) {
        *(undefined8 *)(src + (size - 0x10)) = *(undefined8 *)(src + (long)local_a8 + -0x10);
        *(undefined8 *)(src + (size - 8)) = *(undefined8 *)(src + (long)local_a8 + -8);
      }
      else if (src < (char *)0x41) {
        *(undefined8 *)(size + 0x10) = *(undefined8 *)((long)local_a8 + 0x10);
        *(undefined8 *)(size + 0x18) = *(undefined8 *)((long)local_a8 + 0x18);
        *(undefined8 *)(src + (size - 0x20)) = *(undefined8 *)(src + (long)local_a8 + -0x20);
        *(undefined8 *)(src + (size - 0x18)) = *(undefined8 *)(src + (long)local_a8 + -0x18);
        *(undefined8 *)(src + (size - 0x10)) = *(undefined8 *)(src + (long)local_a8 + -0x10);
        *(undefined8 *)(src + (size - 8)) = *(undefined8 *)(src + (long)local_a8 + -8);
      }
      else {
        for (local_118 = 0x10; (char *)(local_118 + 0x40U) < src; local_118 = local_118 + 0x40) {
          local_10 = (long)local_a8 + local_118 + 0x40;
          local_20 = size + local_118 + 0x40;
          memcpy((void *)(size + local_118),(void *)((long)local_a8 + local_118),0x40);
        }
        memcpy(src + (size - 0x40),(char *)((long)local_a8 + (long)src) + -0x40,0x40);
      }
    }
    uVar4 = arena_bits(this);
    if (uVar4 == 0) {
      if (dst._7_1_ == kZeroInit) {
        NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 5));
      }
      else {
        NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 4));
      }
    }
    else if (dst._7_1_ == kZeroInit) {
      NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 7));
    }
    else {
      NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 6));
    }
    offset_2 = arena_bits(this);
    if (offset_2 != 0) {
      do {
        tVar2 = absl::lts_20240722::countr_zero<unsigned_long>(offset_2);
        absl_log_internal_check_op_result_2 = (string *)((long)tVar2 * 8);
        local_140 = absl::lts_20240722::log_internal::GetReferenceableValue
                              ((unsigned_long)&absl_log_internal_check_op_result_2->_M_string_length
                              );
        local_148 = absl::lts_20240722::log_internal::GetReferenceableValue((unsigned_long)src);
        local_138 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                              (&local_140,&local_148,"offset + sizeof(Arena*) <= size");
        if (local_138 != (string *)0x0) {
          auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_138);
          local_168 = auVar5._8_8_;
          absl_log_internal_check_op_result_3 = auVar5._0_8_;
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_160,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
                     ,0x4fd,absl_log_internal_check_op_result_3,local_168);
          pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_160);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_149,pLVar3);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_160);
        }
        v1_00 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                          ((Arena **)(&absl_log_internal_check_op_result_2->_M_dataplus + size));
        local_180 = (void *)0x0;
        v2_00 = absl::lts_20240722::log_internal::GetReferenceableValue<decltype(nullptr)>
                          (&local_180);
        local_178 = absl::lts_20240722::log_internal::
                    Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                              (v1_00,v2_00,"*reinterpret_cast<Arena**>(dst + offset) == nullptr");
        if (local_178 != (string *)0x0) {
          auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_178);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_198,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.h"
                     ,0x500,auVar5._0_8_,auVar5._8_8_);
          pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_198);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_181,pLVar3);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_198);
        }
        *(string **)(&absl_log_internal_check_op_result_2->_M_dataplus + size) =
             absl_log_internal_check_op_result;
        offset_2 = offset_2 - 1 & offset_2;
        local_178 = (string *)0x0;
      } while (offset_2 != 0);
      local_178 = (string *)0x0;
      offset_2 = 0;
    }
    *(undefined8 *)size = *mem_local;
    *(undefined8 *)(size + 8) = *(undefined8 *)((long)mem_local + 8);
    *(string **)(size + 8) = absl_log_internal_check_op_result;
    this_local = (MessageCreator *)
                 Launder<google::protobuf::MessageLite>((MessageLite *)arena_local);
  }
  return (MessageLite *)this_local;
}

Assistant:

PROTOBUF_ALWAYS_INLINE inline MessageLite* MessageCreator::PlacementNew(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, void* mem, Arena* arena) const {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) % alignment_, 0u);
  const Tag as_tag = tag();
  // When the feature is not enabled we skip the `as_tag` check since it is
  // unnecessary. Except for testing, where we want to test the copy logic even
  // when we can't use it for real messages.
  constexpr bool kMustBeFunc = !test_call && !internal::EnableCustomNew();
  static_assert(kFunc < 0 && !(kZeroInit < 0) && !(kMemcpy < 0),
                "Only kFunc must be the only negative value");
  if (ABSL_PREDICT_FALSE(kMustBeFunc || as_tag < 0)) {
    PROTOBUF_DEBUG_COUNTER("MessageCreator.Func").Inc();
    return static_cast<MessageLite*>(func_(prototype_for_func, mem, arena));
  }

  char* dst = static_cast<char*>(mem);
  const size_t size = allocation_size_;
  const char* src = reinterpret_cast<const char*>(prototype_for_copy);

  // These are a bit more efficient than calling normal memset/memcpy because:
  //  - We know the minimum size is 16. We have a fallback for when it is not.
  //  - We can "underflow" the buffer because those are the MessageLite bytes
  //    we will set later.
#ifndef PROTO2_OPENSOURCE
  // This manual handling shows a 1.85% improvement in the parsing
  // microbenchmark.
  // TODO: Verify this is still the case.
#endif  // !PROTO2_OPENSOUCE
  if (as_tag == kZeroInit) {
    // Make sure the input is really all zeros.
    ABSL_DCHECK(std::all_of(src + sizeof(MessageLite), src + size,
                            [](auto c) { return c == 0; }));

    if (sizeof(MessageLite) != 16) {
      memset(dst, 0, size);
    } else if (size <= 32) {
      memset(dst + size - 16, 0, 16);
    } else if (size <= 64) {
      memset(dst + 16, 0, 16);
      memset(dst + size - 32, 0, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memset(dst + offset, 0, 64);
      }
      memset(dst + size - 64, 0, 64);
    }
  } else {
    ABSL_DCHECK_EQ(+as_tag, +kMemcpy);

    if (sizeof(MessageLite) != 16) {
      memcpy(dst, src, size);
    } else if (size <= 32) {
      memcpy(dst + size - 16, src + size - 16, 16);
    } else if (size <= 64) {
      memcpy(dst + 16, src + 16, 16);
      memcpy(dst + size - 32, src + size - 32, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCache(src + offset + 64);
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memcpy(dst + offset, src + offset, 64);
      }
      memcpy(dst + size - 64, src + size - 64, 64);
    }
  }

  if (arena_bits() != 0) {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.ZeroArena").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.McpyArena").Inc();
    }
  } else {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Zero").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Mcpy").Inc();
    }
  }

  if (internal::PerformDebugChecks() || arena != nullptr) {
    if (uintptr_t offsets = arena_bits()) {
      do {
        const size_t offset = absl::countr_zero(offsets) * sizeof(Arena*);
        ABSL_DCHECK_LE(offset + sizeof(Arena*), size);
        // Verify we are overwriting a null pointer. If we are not, there is a
        // bug somewhere.
        ABSL_DCHECK_EQ(*reinterpret_cast<Arena**>(dst + offset), nullptr);
        memcpy(dst + offset, &arena, sizeof(arena));
        offsets &= offsets - 1;
      } while (offsets != 0);
    }
  }

  // The second memcpy overwrites part of the first, but the compiler should
  // avoid the double-write. It's easier than trying to avoid the overlap.
  memcpy(dst, static_cast<const void*>(prototype_for_copy),
         sizeof(MessageLite));
  memcpy(dst + PROTOBUF_FIELD_OFFSET(MessageLite, _internal_metadata_), &arena,
         sizeof(arena));
  return Launder(reinterpret_cast<MessageLite*>(mem));
}